

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::GlobalObject::GetItemSetter
          (GlobalObject *this,uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  RecyclableObject *instance;
  DescriptorFlags local_2c [2];
  DescriptorFlags flags;
  
  local_2c[0] = DynamicObject::GetItemSetter((DynamicObject *)this,index,setterValue,requestContext)
  ;
  if ((local_2c[0] == None) &&
     ((instance = (this->directHostObject).ptr, instance != (RecyclableObject *)0x0 ||
      (instance = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr,
      instance != (RecyclableObject *)0x0)))) {
    JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem
              (instance,index,setterValue,local_2c,requestContext,0);
  }
  return local_2c[0];
}

Assistant:

DescriptorFlags GlobalObject::GetItemSetter(uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
        DescriptorFlags flags = DynamicObject::GetItemSetter(index, setterValue, requestContext);
        if (flags == None)
        {
            if (this->directHostObject)
            {
                // We need to look up the prototype chain here.
                JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(this->directHostObject, index, setterValue, &flags, requestContext);
            }
            else if (this->hostObject)
            {
                JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(this->hostObject, index, setterValue, &flags, requestContext);
            }
        }

        return flags;
    }